

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

UninterpretedOption_NamePart * __thiscall
google::protobuf::UninterpretedOption_NamePart::New(UninterpretedOption_NamePart *this,Arena *arena)

{
  UninterpretedOption_NamePart *this_00;
  
  this_00 = (UninterpretedOption_NamePart *)operator_new(0x28);
  UninterpretedOption_NamePart(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::UninterpretedOption_NamePart>(arena,this_00);
  }
  return this_00;
}

Assistant:

UninterpretedOption_NamePart* UninterpretedOption_NamePart::New(::google::protobuf::Arena* arena) const {
  UninterpretedOption_NamePart* n = new UninterpretedOption_NamePart;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}